

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_LineEffect
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  AActor *activator;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  VMValue *pVVar7;
  char *pcVar8;
  bool bVar9;
  maplinedef_t oldjunk;
  line_t_conflict junk;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      activator = (AActor *)(param->field_0).field_1.a;
      if (activator != (AActor *)0x0) {
        if ((activator->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
          (activator->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar6 = (activator->super_DThinker).super_DObject.Class;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar2 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar2) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003db0ac;
        }
      }
      if (numparam == 1) {
        pVVar7 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db109:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x149c,
                        "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar7 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar8 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003db109;
        }
      }
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003dafd2;
        pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003dafd2:
          iVar3 = 0;
          uVar5 = 0;
          if (((activator->flags6).Value & 0x8000) == 0) {
            oldjunk.special = (short)pVVar7[1].field_0.i;
            if (oldjunk.special == 0) {
              uVar5 = 0;
            }
            else {
              oldjunk.tag = (short)param[2].field_0.i;
              P_TranslateLineDef((line_t *)&junk,&oldjunk,-1);
              iVar4 = P_ExecuteSpecial(junk.special,(line_t *)0x0,activator,false,junk.args[0],
                                       junk.args[1],junk.args[2],junk.args[3],junk.args[4]);
              uVar5 = (uint)(iVar4 != 0);
              if ((iVar4 != 0) && (uVar5 = 1, (junk.flags._1_1_ & 2) == 0)) {
                pbVar1 = (byte *)((long)&(activator->flags6).Value + 1);
                *pbVar1 = *pbVar1 | 0x80;
              }
            }
          }
          if (0 < numret) {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x14ae,
                            "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\0') {
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            *(uint *)ret->Location = uVar5;
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar8 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x149d,
                    "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003db0ac:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x149b,
                "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LineEffect)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(special);
	PARAM_INT_DEF(tag);

	line_t junk;
	maplinedef_t oldjunk;
	bool res = false;
	if (!(self->flags6 & MF6_LINEDONE))						// Unless already used up
	{
		if ((oldjunk.special = special))					// Linedef type
		{
			oldjunk.tag = tag;								// Sector tag for linedef
			P_TranslateLineDef(&junk, &oldjunk);			// Turn into native type
			res = !!P_ExecuteSpecial(junk.special, NULL, self, false, junk.args[0], 
				junk.args[1], junk.args[2], junk.args[3], junk.args[4]); 
			if (res && !(junk.flags & ML_REPEAT_SPECIAL))	// If only once,
				self->flags6 |= MF6_LINEDONE;				// no more for this thing
		}
	}
	ACTION_RETURN_BOOL(res);
}